

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O3

RK_S32 VPUClientSendReg(int socket,RK_U32 *regs,RK_U32 nregs)

{
  int __errnum;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  VPUReq_t req;
  MppReqV1 reqs_tmp [2];
  
  if (nregs != 0 && vpu_debug != 0) {
    uVar4 = 0;
    do {
      _mpp_log_l(4,"vpu","set reg[%03d]: %08x\n",0,uVar4 & 0xffffffff,regs[uVar4]);
      uVar4 = uVar4 + 1;
    } while (nregs != uVar4);
  }
  if (ioctl_version < 1) {
    uVar4 = 0x40086c03;
  }
  else {
    uVar4 = 0x40047601;
  }
  iVar1 = ioctl(socket,uVar4);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    __errnum = *piVar2;
    pcVar3 = strerror(__errnum);
    _mpp_log_l(2,"vpu","ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n","VPUClientSendReg",iVar1,
               __errnum,pcVar3);
  }
  return iVar1;
}

Assistant:

RK_S32 VPUClientSendReg(int socket, RK_U32 *regs, RK_U32 nregs)
{
    int fd = socket;
    RK_S32 ret;
    VPUReq_t req;

    if (vpu_debug) {
        RK_U32 i;

        for (i = 0; i < nregs; i++)
            mpp_log("set reg[%03d]: %08x\n", i, regs[i]);
    }

    if (ioctl_version > 0) {
        MppReqV1 reqs[3];
        RK_U32 reg_size = nregs;

        VpuExtraInfo *extra_info = (VpuExtraInfo*)(regs + (nregs - VPU_EXTRA_INFO_SIZE));

        reqs[0].cmd = MPP_CMD_SET_REG_WRITE;
        reqs[0].flag = 0;
        reqs[0].offset = 0;
        reqs[0].size =  reg_size * sizeof(RK_U32);
        reqs[0].data_ptr = REQ_DATA_PTR((void*)regs);
        reqs[0].flag |= VPU_MPP_FLAGS_MULTI_MSG;

        reqs[1].cmd = MPP_CMD_SET_REG_READ;
        reqs[1].flag = 0;
        reqs[1].offset = 0;
        reqs[1].size =  reg_size * sizeof(RK_U32);
        reqs[1].data_ptr = REQ_DATA_PTR((void*)regs);

        if (extra_info && extra_info->magic == VPU_EXTRA_INFO_MAGIC) {
            reg_size = nregs - VPU_EXTRA_INFO_SIZE;
            reqs[2].cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
            reqs[2].flag = 0;
            reqs[2].offset = 0;
            reqs[2].size = extra_info->count * sizeof(extra_info->patchs[0]);
            reqs[2].data_ptr = REQ_DATA_PTR((void *)&extra_info->patchs[0]);

            reqs[0].size =  reg_size * sizeof(RK_U32);
            reqs[1].size =  reg_size * sizeof(RK_U32);
            reqs[1].flag |= VPU_MPP_FLAGS_MULTI_MSG;
            reqs[2].flag |= VPU_MPP_FLAGS_LAST_MSG;
            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &reqs);
        } else {
            MppReqV1 reqs_tmp[2];
            reqs[1].flag |= VPU_MPP_FLAGS_LAST_MSG;
            memcpy(reqs_tmp, reqs, sizeof(MppReqV1) * 2);
            ret = (RK_S32)ioctl(fd, MPP_IOC_CFG_V1, &reqs_tmp);
        }

    } else {
        nregs *= sizeof(RK_U32);
        req.req     = regs;
        req.size    = nregs;
        ret = (RK_S32)ioctl(fd, VPU_IOC_SET_REG, &req);
    }

    if (ret)
        mpp_err_f("ioctl VPU_IOC_SET_REG failed ret %d errno %d %s\n", ret, errno, strerror(errno));

    return ret;
}